

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdProc.c
# Opt level: O0

void dsdKernelComputeSumOfComponents
               (Dsd_Manager_t *pDsdMan,Dsd_Node_t **pCommon,int nCommon,DdNode **pCompF,
               DdNode **pCompS,int fExor)

{
  DdManager *dd_00;
  DdNode *n;
  Dsd_Node_t *pDVar1;
  DdNode *local_80;
  int local_74;
  int i;
  Dsd_Node_t *pDER;
  Dsd_Node_t *pDE;
  DdNode *bS;
  DdNode *bTemp;
  DdNode *bFadd;
  DdNode *bF;
  DdManager *dd;
  int fExor_local;
  DdNode **pCompS_local;
  DdNode **pCompF_local;
  int nCommon_local;
  Dsd_Node_t **pCommon_local;
  Dsd_Manager_t *pDsdMan_local;
  
  dd_00 = pDsdMan->dd;
  pDE = (Dsd_Node_t *)0x0;
  bFadd = (DdNode *)((ulong)dd_00->one ^ 1);
  Cudd_Ref(bFadd);
  if (pCompS != (DdNode **)0x0) {
    pDE = (Dsd_Node_t *)dd_00->one;
    Cudd_Ref((DdNode *)pDE);
  }
  if (0 < nCommon) {
    for (local_74 = 0; n = bFadd, local_74 < nCommon; local_74 = local_74 + 1) {
      pDVar1 = (Dsd_Node_t *)((ulong)pCommon[local_74] & 0xfffffffffffffffe);
      if (pCommon[local_74] == pDVar1) {
        local_80 = pDVar1->G;
      }
      else {
        local_80 = (DdNode *)((ulong)pDVar1->G ^ 1);
      }
      if (fExor == 0) {
        bFadd = Cudd_bddOr(dd_00,bFadd,local_80);
      }
      else {
        bFadd = Cudd_bddXor(dd_00,bFadd,local_80);
      }
      Cudd_Ref(bFadd);
      Cudd_RecursiveDeref(dd_00,n);
      if (pCompS != (DdNode **)0x0) {
        pDVar1 = (Dsd_Node_t *)Cudd_bddAnd(dd_00,(DdNode *)pDE,pDVar1->S);
        Cudd_Ref((DdNode *)pDVar1);
        Cudd_RecursiveDeref(dd_00,(DdNode *)pDE);
        pDE = pDVar1;
      }
    }
    Cudd_Deref(bFadd);
    *pCompF = bFadd;
    if (pCompS != (DdNode **)0x0) {
      Cudd_Deref((DdNode *)pDE);
      *pCompS = (DdNode *)pDE;
    }
    return;
  }
  __assert_fail("nCommon > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bdd/dsd/dsdProc.c"
                ,0x59f,
                "void dsdKernelComputeSumOfComponents(Dsd_Manager_t *, Dsd_Node_t **, int, DdNode **, DdNode **, int)"
               );
}

Assistant:

void dsdKernelComputeSumOfComponents( Dsd_Manager_t * pDsdMan, Dsd_Node_t ** pCommon, int nCommon, DdNode ** pCompF, DdNode ** pCompS, int fExor )
{
    DdManager * dd = pDsdMan->dd;
    DdNode * bF, * bFadd, * bTemp;
        DdNode * bS = NULL; // Suppress "might be used uninitialized"
    Dsd_Node_t * pDE, * pDER;
    int i;

    // start the function
    bF = b0; Cudd_Ref( bF );
    // start the support
    if ( pCompS )
        bS = b1, Cudd_Ref( bS );

    assert( nCommon > 0 );
    for ( i = 0; i < nCommon; i++ )
    {
        pDE  = pCommon[i];
        pDER = Dsd_Regular( pDE );
        bFadd = (pDE != pDER)? Cudd_Not(pDER->G): pDER->G;
        // add to the function
        if ( fExor )
            bF = Cudd_bddXor( dd, bTemp = bF, bFadd );
        else
            bF = Cudd_bddOr( dd, bTemp = bF, bFadd );
        Cudd_Ref( bF );
        Cudd_RecursiveDeref( dd, bTemp );
        if ( pCompS )
        {
            // add to the support
            bS = Cudd_bddAnd( dd, bTemp = bS, pDER->S );  Cudd_Ref( bS );
            Cudd_RecursiveDeref( dd, bTemp );
        }
    }
    // return the function
    Cudd_Deref( bF );
    *pCompF = bF;

    // return the support
    if ( pCompS )
        Cudd_Deref( bS ), *pCompS = bS;
}